

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalParameterData.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::FundamentalParameterData::Decode
          (FundamentalParameterData *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x27 < KVar1) {
    KDataStream::Read<float>(stream,(float *)&this->m_f32Freq);
    KDataStream::Read<float>(stream,(float *)&this->m_f32FreqRange);
    KDataStream::Read<float>(stream,(float *)&this->m_f32EffectiveRadiatedPower);
    KDataStream::Read<float>(stream,(float *)&this->m_f32PulseRepetitionFreq);
    KDataStream::Read<float>(stream,(float *)&this->m_f32PulseWidth);
    KDataStream::Read<float>(stream,(float *)&this->m_f32BeamAzimuthCenter);
    KDataStream::Read<float>(stream,(float *)&this->m_f32BeamAzimuthSweep);
    KDataStream::Read<float>(stream,(float *)&this->m_f32BeamElevationCenter);
    KDataStream::Read<float>(stream,(float *)&this->m_f32BeamElevationSweep);
    KDataStream::Read<float>(stream,(float *)&this->m_f32BeamSweepSync);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void FundamentalParameterData::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < FUNDAMENTAL_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_f32Freq
           >> m_f32FreqRange
           >> m_f32EffectiveRadiatedPower
           >> m_f32PulseRepetitionFreq
           >> m_f32PulseWidth
           >> m_f32BeamAzimuthCenter
           >> m_f32BeamAzimuthSweep
           >> m_f32BeamElevationCenter
           >> m_f32BeamElevationSweep
           >> m_f32BeamSweepSync;
}